

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O0

void anon_unknown.dwarf_12b021::fillHeaderTrailer(Message *message)

{
  Header *pHVar1;
  Trailer *this;
  CheckSum local_298;
  UTCTIMESTAMP local_240;
  SendingTime local_228;
  MsgSeqNum local_1d0;
  allocator<char> local_171;
  STRING local_170;
  TargetCompID local_150;
  allocator<char> local_f1;
  STRING local_f0;
  SenderCompID local_d0;
  BodyLength local_68;
  Message *local_10;
  Message *message_local;
  
  local_10 = message;
  pHVar1 = FIX44::Message::getHeader(message);
  FIX::BodyLength::BodyLength(&local_68,0);
  FIX44::Header::set(pHVar1,&local_68);
  FIX::BodyLength::~BodyLength(&local_68);
  pHVar1 = FIX44::Message::getHeader(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"FIXTEST",&local_f1);
  FIX::SenderCompID::SenderCompID(&local_d0,&local_f0);
  FIX44::Header::set(pHVar1,&local_d0);
  FIX::SenderCompID::~SenderCompID(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  pHVar1 = FIX44::Message::getHeader(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"TW",&local_171);
  FIX::TargetCompID::TargetCompID(&local_150,&local_170);
  FIX44::Header::set(pHVar1,&local_150);
  FIX::TargetCompID::~TargetCompID(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  pHVar1 = FIX44::Message::getHeader(local_10);
  FIX::MsgSeqNum::MsgSeqNum(&local_1d0,1);
  FIX44::Header::set(pHVar1,&local_1d0);
  FIX::MsgSeqNum::~MsgSeqNum(&local_1d0);
  pHVar1 = FIX44::Message::getHeader(local_10);
  FIX::UtcTimeStamp::now();
  FIX::SendingTime::SendingTime(&local_228,&local_240);
  FIX44::Header::set(pHVar1,&local_228);
  FIX::SendingTime::~SendingTime(&local_228);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_240);
  this = FIX44::Message::getTrailer(local_10);
  FIX::CheckSum::CheckSum(&local_298,0);
  FIX44::Trailer::set(this,&local_298);
  FIX::CheckSum::~CheckSum(&local_298);
  return;
}

Assistant:

static void fillHeaderTrailer(FIX44::Message &message) {
  message.getHeader().set(FIX::BodyLength(0));
  message.getHeader().set(SenderCompID("FIXTEST"));
  message.getHeader().set(TargetCompID("TW"));
  message.getHeader().set(MsgSeqNum(1));
  message.getHeader().set(SendingTime(UtcTimeStamp::now()));
  message.getTrailer().set(CheckSum(0));
}